

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O3

int Aig_ObjReverseLevelNew(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  char *__function;
  uint uVar4;
  char *__file;
  char *__assertion;
  uint uVar5;
  void *pvVar6;
  int iVar7;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTiming.c"
                  ,0x79,"int Aig_ObjReverseLevelNew(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) == 0) {
    iVar7 = 1;
  }
  else {
    uVar5 = 0xffffffff;
    iVar7 = 0;
    uVar4 = 0;
    do {
      if (uVar4 == 0) {
        if (p->nFansAlloc <= pObj->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar2 = pObj->Id * 5;
      }
      else {
        if (p->nFansAlloc <= (int)uVar5 / 2) {
          __assertion = "iFan/2 < p->nFansAlloc";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
          ;
          __function = "int Aig_ObjFanoutNext(Aig_Man_t *, int)";
          goto LAB_006da111;
        }
        iVar2 = (uVar5 & 1) + ((int)uVar5 >> 1) * 5 + 3;
      }
      pVVar1 = p->vObjs;
      uVar5 = p->pFanData[iVar2];
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        uVar3 = (int)uVar5 >> 1;
        if (((int)uVar3 < 0) || (pVVar1->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar6 = pVVar1->pArray[uVar3];
      }
      if (p->vLevelR == (Vec_Int_t *)0x0) {
        __assert_fail("p->vLevelR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTiming.c"
                      ,0x30,"int Aig_ObjReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
      }
      Vec_IntFillExtra(p->vLevelR,*(int *)((long)pvVar6 + 0x24) + 1,(int)p->pFanData);
      iVar2 = *(int *)((long)pvVar6 + 0x24);
      if (((long)iVar2 < 0) || (p->vLevelR->nSize <= iVar2)) {
        __assertion = "i >= 0 && i < p->nSize";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
        ;
        __function = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_006da111:
        __assert_fail(__assertion,__file,0x1a9,__function);
      }
      iVar2 = p->vLevelR->pArray[iVar2];
      if (iVar7 <= iVar2) {
        iVar7 = iVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(uint *)&pObj->field_0x18 >> 6);
    iVar7 = iVar7 + 1;
  }
  return iVar7;
}

Assistant:

int Aig_ObjReverseLevelNew( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1, LevelCur, Level = 0;
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
    {
        LevelCur = Aig_ObjReverseLevel( p, pFanout );
        Level = Abc_MaxInt( Level, LevelCur );
    }
    return Level + 1;
}